

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::TokenTest_SigningMessage_Test::~TokenTest_SigningMessage_Test
          (TokenTest_SigningMessage_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TokenTest, SigningMessage)
{
    Config config;

    config.mDomainName = "Thread";

    config.mTrustAnchor = {kCommTrustAnchor.begin(), kCommTrustAnchor.end()};
    config.mTrustAnchor.push_back(0);

    config.mCertificate = {kCommCert.begin(), kCommCert.end()};
    config.mCertificate.push_back(0);

    config.mPrivateKey = {kCommKey.begin(), kCommKey.end()};
    config.mPrivateKey.push_back(0);

    struct event_base *eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    TokenManager tokenManager{eventBase};

    EXPECT_EQ(tokenManager.Init(config), ErrorCode::kNone);

    ByteArray signedToken;
    EXPECT_EQ(utils::Hex(signedToken, kSignedToken), ErrorCode::kNone);
    EXPECT_EQ(tokenManager.SetToken(signedToken), ErrorCode::kNone);
    EXPECT_EQ(tokenManager.GetToken(), signedToken);

    coap::Message pet{coap::Type::kConfirmable, coap::Code::kPost};
    EXPECT_EQ(pet.SetUriPath(uri::kPetitioning), ErrorCode::kNone);
    EXPECT_EQ(AppendTlv(pet, {tlv::Type::kCommissionerId, config.mId}), ErrorCode::kNone);

    ByteArray signature;
    EXPECT_EQ(tokenManager.SignMessage(signature, pet), ErrorCode::kNone);
    EXPECT_EQ(tokenManager.ValidateSignature(signature, pet), ErrorCode::kNone);
}